

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprintint.h
# Opt level: O0

int print_uint64(uint64_t n,char *p)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint64_t x;
  char *dp;
  char *pcStack_20;
  int k;
  char *p_local;
  uint64_t n_local;
  
  if (n < 1000000000) {
    n_local._4_4_ = print_uint32((uint32_t)n,p);
  }
  else {
    if (n < 10000000000000) {
      if (n < 100000000000) {
        if (n < 10000000000) {
          dp._4_4_ = 10;
        }
        else {
          dp._4_4_ = 0xb;
        }
      }
      else if (n < 1000000000000) {
        dp._4_4_ = 0xc;
      }
      else {
        dp._4_4_ = 0xd;
      }
    }
    else if (n < 10000000000000000) {
      if (n < 1000000000000000) {
        if (n < 100000000000000) {
          dp._4_4_ = 0xe;
        }
        else {
          dp._4_4_ = 0xf;
        }
      }
      else {
        dp._4_4_ = 0x10;
      }
    }
    else if (n < 1000000000000000000) {
      if (n < 100000000000000000) {
        dp._4_4_ = 0x11;
      }
      else {
        dp._4_4_ = 0x12;
      }
    }
    else if (n < 10000000000000000000) {
      dp._4_4_ = 0x13;
    }
    else {
      dp._4_4_ = 0x14;
    }
    pcStack_20 = p + (int)dp._4_4_;
    *pcStack_20 = '\0';
    p_local = (char *)n;
    if ((dp._4_4_ & 1) == 0) {
      switch(dp._4_4_) {
      case 0x14:
        pcStack_20 = pcStack_20 + -2;
        p_local = (char *)(n / 100);
        *(undefined2 *)pcStack_20 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (n % 100) * 2);
      case 0x12:
        pcStack_20 = pcStack_20 + -2;
        uVar2 = (ulong)p_local % 100;
        p_local = (char *)((ulong)p_local / 100);
        *(undefined2 *)pcStack_20 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + uVar2 * 2);
      case 0x10:
        pcStack_20 = pcStack_20 + -2;
        uVar2 = (ulong)p_local % 100;
        p_local = (char *)((ulong)p_local / 100);
        *(undefined2 *)pcStack_20 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + uVar2 * 2);
      case 0xe:
        pcStack_20 = pcStack_20 + -2;
        uVar2 = (ulong)p_local % 100;
        p_local = (char *)((ulong)p_local / 100);
        *(undefined2 *)pcStack_20 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + uVar2 * 2);
      case 0xc:
        pcStack_20 = pcStack_20 + -2;
        uVar2 = (ulong)p_local % 100;
        p_local = (char *)((ulong)p_local / 100);
        *(undefined2 *)pcStack_20 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + uVar2 * 2);
      case 10:
        pcStack_20 = pcStack_20 + -2;
        uVar2 = (ulong)p_local % 100;
        p_local = (char *)((ulong)p_local / 100);
        *(undefined2 *)pcStack_20 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + uVar2 * 2);
      default:
      }
    }
    else {
      switch(dp._4_4_) {
      case 0x13:
        pcStack_20 = pcStack_20 + -2;
        p_local = (char *)(n / 100);
        *(undefined2 *)pcStack_20 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (n % 100) * 2);
      case 0x11:
        pcStack_20 = pcStack_20 + -2;
        uVar2 = (ulong)p_local % 100;
        p_local = (char *)((ulong)p_local / 100);
        *(undefined2 *)pcStack_20 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + uVar2 * 2);
      case 0xf:
        pcStack_20 = pcStack_20 + -2;
        uVar2 = (ulong)p_local % 100;
        p_local = (char *)((ulong)p_local / 100);
        *(undefined2 *)pcStack_20 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + uVar2 * 2);
      case 0xd:
        pcStack_20 = pcStack_20 + -2;
        uVar2 = (ulong)p_local % 100;
        p_local = (char *)((ulong)p_local / 100);
        *(undefined2 *)pcStack_20 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + uVar2 * 2);
      case 0xb:
        *(undefined2 *)(pcStack_20 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + ((ulong)p_local % 100) * 2);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (ulong)p_local / 100;
        pcStack_20[-3] = SUB161(auVar1 % ZEXT816(10),0) + '0';
        p_local = (char *)(((ulong)p_local / 100) / 10);
        pcStack_20 = pcStack_20 + -3;
      default:
      }
    }
    *(undefined2 *)(pcStack_20 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + ((ulong)p_local % 100) * 2);
    uVar2 = ((ulong)p_local / 100) / 100;
    *(undefined2 *)(pcStack_20 + -4) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (((ulong)p_local / 100) % 100) * 2);
    *(undefined2 *)(pcStack_20 + -6) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (uVar2 % 100) * 2);
    *(undefined2 *)(pcStack_20 + -8) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + ((uVar2 / 100) % 100) * 2);
    n_local._4_4_ = dp._4_4_;
  }
  return n_local._4_4_;
}

Assistant:

static int print_uint64(uint64_t n, char *p)
{
    int k = 0;
    const char *dp;
    const uint64_t x = 1000000000ULL;

    if (n < x) {
        return print_uint32((uint32_t)n, p);
    }
    if(n >= 10000ULL * x) {
        if(n >= 10000000ULL * x) {
            if(n >= 1000000000ULL * x) {
                if (n >= 10000000000ULL * x) {
                    k = 11 + 9;
                } else {
                    k = 10 + 9;
                }
            } else if(n >= 100000000ULL * x) {
                k = 9 + 9;
            } else {
               k = 8 + 9;
            }
        } else {
            if(n >= 1000000ULL * x) {
                k = 7 + 9;
            } else if(n >= 100000ULL * x) {
                k = 6 + 9;
            } else {
                k = 5 + 9;
            }
        }
    } else {
        if(n >= 100ULL * x) {
            if(n >= 1000ULL * x) {
                k = 4 + 9;
            } else {
                k = 3 + 9;
            }
        } else {
            if(n >= 10ULL * x) {
                k = 2 + 9;
            } else {
                k = 1 + 9;
            }
        }
    }
    p += k;
    *p = '\0';
    if (k & 1) {
        switch (k) {
        case 19:
            __print_stage();
	    pattribute(fallthrough);
        case 17:
            __print_stage();
	    pattribute(fallthrough);
        case 15:
            __print_stage();
	    pattribute(fallthrough);
        case 13:
            __print_stage();
	    pattribute(fallthrough);
        case 11:
            __print_stage()
            __print_short_stage();
        }
    } else {
        switch (k) {
        case 20:
            __print_stage();
	    pattribute(fallthrough);
        case 18:
            __print_stage();
	    pattribute(fallthrough);
        case 16:
            __print_stage();
	    pattribute(fallthrough);
        case 14:
            __print_stage();
	    pattribute(fallthrough);
        case 12:
            __print_stage();
	    pattribute(fallthrough);
        case 10:
            __print_stage();
        }
    }
    __print_long_stage()
    __print_long_stage()
    return k;
}